

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

void Lpk_NodeCutSignature(Lpk_Cut_t *pCut)

{
  uint uVar1;
  uint local_14;
  uint i;
  Lpk_Cut_t *pCut_local;
  
  pCut->uSign[1] = 0;
  pCut->uSign[0] = 0;
  local_14 = 0;
  while( true ) {
    if ((*(uint *)pCut & 0x3f) <= local_14) {
      return;
    }
    uVar1 = (uint)((pCut->pLeaves[local_14] & 0x20U) != 0);
    pCut->uSign[(int)uVar1] = 1 << ((byte)pCut->pLeaves[local_14] & 0x1f) | pCut->uSign[(int)uVar1];
    if ((local_14 != (*(uint *)pCut & 0x3f) - 1) &&
       (pCut->pLeaves[local_14 + 1] <= pCut->pLeaves[local_14])) break;
    local_14 = local_14 + 1;
  }
  __assert_fail("pCut->pLeaves[i] < pCut->pLeaves[i+1]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                ,0x1cd,"void Lpk_NodeCutSignature(Lpk_Cut_t *)");
}

Assistant:

void Lpk_NodeCutSignature( Lpk_Cut_t * pCut )
{
    unsigned i;
    pCut->uSign[0] = pCut->uSign[1] = 0;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pCut->uSign[(pCut->pLeaves[i] & 32) > 0] |= (1 << (pCut->pLeaves[i] & 31));
        if ( i != pCut->nLeaves - 1 )
            assert( pCut->pLeaves[i] < pCut->pLeaves[i+1] );
    }
}